

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

void openjtalk_setBeta(OpenJTalk *oj,double f)

{
  double f_00;
  
  if (oj != (OpenJTalk *)0x0) {
    oj->errorCode = OPENJTALKERROR_NO_ERROR;
    f_00 = 0.0;
    if ((0.0 <= f) && (f_00 = f, 1.0 < f)) {
      f_00 = 1.0;
    }
    oj->beta = f_00;
    Open_JTalk_set_beta(oj->open_jtalk,f_00);
    return;
  }
  g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_setBeta(OpenJTalk *oj, double f)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (f < 0.0)
	{
		f = 0.0;
	}
	else if (f > 1.0)
	{
		f = 1.0;
	}
	oj->beta = f;
	Open_JTalk_set_beta(oj->open_jtalk, oj->beta);
}